

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIDFontWriter.cpp
# Opt level: O2

EStatusCode __thiscall
CIDFontWriter::WriteToUnicodeMap(CIDFontWriter *this,ObjectIDType inToUnicodeMap)

{
  EStatusCode EVar1;
  Trace *this_00;
  PDFStream *this_01;
  IByteWriter *inStreamForWriting;
  long lVar2;
  ulong uVar3;
  ulong inIntegerToken;
  CIDFontWriter *this_02;
  pointer ppVar4;
  ulong uVar5;
  allocator<char> local_69;
  PrimitiveObjectsWriter primitiveWriter;
  string local_50;
  
  EVar1 = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inToUnicodeMap);
  if (EVar1 == eSuccess) {
    this_01 = ObjectsContext::StartPDFStream(this->mObjectsContext,(DictionaryContext *)0x0,false);
    inStreamForWriting = PDFStream::GetWriteStream(this_01);
    PrimitiveObjectsWriter::PrimitiveObjectsWriter(&primitiveWriter,inStreamForWriting);
    ppVar4 = (this->mCharactersVector).
             super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = ((long)(this->mCharactersVector).
                   super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4) / 0x28;
    (*inStreamForWriting->_vptr_IByteWriter[2])
              (inStreamForWriting,
               "/CIDInit /ProcSet findresource begin\n12 dict begin\nbegincmap\n/CIDSystemInfo\n<< /Registry (Adobe)\n/Ordering (UCS) /Supplement 0 >> def\n/CMapName /Adobe-Identity-UCS def\n/CMapType 2 def\n1 begincodespacerange\n"
               ,0xce);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"0000",&local_69);
    PrimitiveObjectsWriter::WriteEncodedHexString(&primitiveWriter,&local_50,eTokenSeparatorSpace);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FFFF",&local_69);
    PrimitiveObjectsWriter::WriteEncodedHexString(&primitiveWriter,&local_50,eTokenSeparatorEndLine)
    ;
    std::__cxx11::string::~string((string *)&local_50);
    (*inStreamForWriting->_vptr_IByteWriter[2])(inStreamForWriting,"endcodespacerange\n",0x12);
    uVar3 = lVar2 - 1;
    if (99 < uVar3) {
      uVar3 = 100;
    }
    PrimitiveObjectsWriter::WriteInteger(&primitiveWriter,uVar3,eTokenSeparatorSpace);
    this_02 = (CIDFontWriter *)&primitiveWriter;
    PrimitiveObjectsWriter::WriteKeyword
              ((PrimitiveObjectsWriter *)this_02,&scBeginBFChar_abi_cxx11_);
    WriteGlyphEntry(this_02,inStreamForWriting,ppVar4[1].second.mEncodedCharacter,
                    &ppVar4[1].second.mUnicodeCharacters);
    ppVar4 = ppVar4 + 2;
    uVar5 = lVar2 - 2;
    uVar3 = 1;
    lVar2 = -1;
    while( true ) {
      if (ppVar4 == (this->mCharactersVector).
                    super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) break;
      if ((uVar3 / 100) * 100 + lVar2 == 0) {
        PrimitiveObjectsWriter::WriteKeyword(&primitiveWriter,&scEndBFChar_abi_cxx11_);
        inIntegerToken = 100;
        if (uVar5 < 100) {
          inIntegerToken = uVar5;
        }
        PrimitiveObjectsWriter::WriteInteger(&primitiveWriter,inIntegerToken,eTokenSeparatorSpace);
        this_02 = (CIDFontWriter *)&primitiveWriter;
        PrimitiveObjectsWriter::WriteKeyword(&primitiveWriter,&scBeginBFChar_abi_cxx11_);
      }
      WriteGlyphEntry(this_02,inStreamForWriting,(ppVar4->second).mEncodedCharacter,
                      &(ppVar4->second).mUnicodeCharacters);
      uVar3 = uVar3 + 1;
      uVar5 = uVar5 - 1;
      lVar2 = lVar2 + -1;
      ppVar4 = ppVar4 + 1;
    }
    PrimitiveObjectsWriter::WriteKeyword(&primitiveWriter,&scEndBFChar_abi_cxx11_);
    (*inStreamForWriting->_vptr_IByteWriter[2])
              (inStreamForWriting,"endcmap CMapName currentdict /CMap defineresource pop end end\n",
               0x3e);
    EVar1 = ObjectsContext::EndPDFStream(this->mObjectsContext,this_01);
    PDFStream::~PDFStream(this_01);
    operator_delete(this_01,0xf0);
    PrimitiveObjectsWriter::~PrimitiveObjectsWriter(&primitiveWriter);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "CIDFontWriter::WriteToUnicodeMap, could not write to unicode map object %ld",
                      inToUnicodeMap);
  }
  return EVar1;
}

Assistant:

EStatusCode CIDFontWriter::WriteToUnicodeMap(ObjectIDType inToUnicodeMap)
{
	EStatusCode status = mObjectsContext->StartNewIndirectObject(inToUnicodeMap);
	if(status != eSuccess)
	{
		TRACE_LOG1("CIDFontWriter::WriteToUnicodeMap, could not write to unicode map object %ld",inToUnicodeMap);
		return status;
	}
	PDFStream* pdfStream = mObjectsContext->StartPDFStream();
	IByteWriter* cmapWriteContext = pdfStream->GetWriteStream();
	PrimitiveObjectsWriter primitiveWriter(cmapWriteContext);
	unsigned long i = 1;
	UIntAndGlyphEncodingInfoVector::iterator it = mCharactersVector.begin() + 1; // skip 0 glyph
	unsigned long vectorSize = (unsigned long)mCharactersVector.size() - 1; // cause 0 is not there

	cmapWriteContext->Write((const Byte*)scCmapHeader,strlen(scCmapHeader));
	primitiveWriter.WriteEncodedHexString(scFourByteRangeStart);
	primitiveWriter.WriteEncodedHexString(scFourByteRangeEnd,eTokenSeparatorEndLine);
	cmapWriteContext->Write((const Byte*)scEndCodeSpaceRange,strlen(scEndCodeSpaceRange));

	if(vectorSize < 100)
		primitiveWriter.WriteInteger(vectorSize);
	else
		primitiveWriter.WriteInteger(100);
	primitiveWriter.WriteKeyword(scBeginBFChar);
	
	WriteGlyphEntry(cmapWriteContext,it->second.mEncodedCharacter,it->second.mUnicodeCharacters);
	++it;
	for(; it != mCharactersVector.end(); ++it,++i)
	{
		if(i % 100 == 0)
		{
			primitiveWriter.WriteKeyword(scEndBFChar);
			if(vectorSize - i < 100)
				primitiveWriter.WriteInteger(vectorSize - i);
			else
				primitiveWriter.WriteInteger(100);
			primitiveWriter.WriteKeyword(scBeginBFChar);
		}
		WriteGlyphEntry(cmapWriteContext,it->second.mEncodedCharacter,it->second.mUnicodeCharacters);
	}
	primitiveWriter.WriteKeyword(scEndBFChar);
	cmapWriteContext->Write((const Byte*)scCmapFooter,strlen(scCmapFooter));
	status = mObjectsContext->EndPDFStream(pdfStream);
	delete pdfStream;
	return status;
}